

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O3

bool __thiscall
cmFLTKWrapUICommand::InitialPass
          (cmFLTKWrapUICommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  pointer pbVar5;
  iterator __position;
  bool bVar6;
  string *psVar7;
  string *psVar8;
  cmSourceFile *this_00;
  long *plVar9;
  pointer ppcVar10;
  size_type *psVar11;
  ulong uVar12;
  long lVar13;
  char *__end;
  long lVar14;
  long lVar15;
  string no_main_dependency;
  string sourceListValue;
  string outputDirectory;
  string cdir;
  string varName;
  cmSourceFile *sf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string cxxres;
  string local_e8;
  string origname;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLine commandLine;
  
  uVar12 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 < 0x21) {
    cdir._M_dataplus._M_p = (pointer)&cdir.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cdir,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&cdir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cdir._M_dataplus._M_p == &cdir.field_2) goto LAB_002416d0;
  }
  else {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cdir._M_dataplus._M_p = (pointer)&cdir.field_2;
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cdir,pcVar3,pcVar3 + psVar7->_M_string_length);
    pcVar4 = (this->super_cmCommand).Makefile;
    paVar2 = &outputDirectory.field_2;
    outputDirectory._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&outputDirectory,"FLTK_FLUID_EXECUTABLE","");
    psVar7 = cmMakefile::GetRequiredDefinition(pcVar4,&outputDirectory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputDirectory._M_dataplus._M_p != paVar2) {
      operator_delete(outputDirectory._M_dataplus._M_p,
                      outputDirectory.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->Target);
    psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    pcVar3 = (psVar8->_M_dataplus)._M_p;
    outputDirectory._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&outputDirectory,pcVar3,pcVar3 + psVar8->_M_string_length);
    sourceListValue._M_dataplus._M_p = (pointer)0x0;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sourceListValue,&outputDirectory);
    cmMakefile::AddIncludeDirectories
              ((this->super_cmCommand).Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceListValue,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourceListValue);
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    psVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar8 != pbVar5) {
      do {
        this_00 = cmMakefile::GetSource((this->super_cmCommand).Makefile,psVar8,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
LAB_00240ed7:
          sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sourceListValue,outputDirectory._M_dataplus._M_p,
                     outputDirectory._M_dataplus._M_p + outputDirectory._M_string_length);
          std::__cxx11::string::append((char *)&sourceListValue);
          cmsys::SystemTools::GetFilenameWithoutExtension(&varName,psVar8);
          std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)varName._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)varName._M_dataplus._M_p != &varName.field_2) {
            operator_delete(varName._M_dataplus._M_p,varName.field_2._M_allocated_capacity + 1);
          }
          varName._M_dataplus._M_p = (pointer)&varName.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&varName,sourceListValue._M_dataplus._M_p,
                     sourceListValue._M_dataplus._M_p + sourceListValue._M_string_length);
          std::__cxx11::string::append((char *)&varName);
          cxxres._M_dataplus._M_p = (pointer)&cxxres.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&cxxres,cdir._M_dataplus._M_p,
                     cdir._M_dataplus._M_p + cdir._M_string_length);
          std::__cxx11::string::append((char *)&cxxres);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&cxxres,(ulong)(psVar8->_M_dataplus)._M_p);
          origname._M_dataplus._M_p = (pointer)&origname.field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar11) {
            origname.field_2._M_allocated_capacity = *psVar11;
            origname.field_2._8_8_ = plVar9[3];
          }
          else {
            origname.field_2._M_allocated_capacity = *psVar11;
            origname._M_dataplus._M_p = (pointer)*plVar9;
          }
          origname._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cxxres._M_dataplus._M_p != &cxxres.field_2) {
            operator_delete(cxxres._M_dataplus._M_p,cxxres.field_2._M_allocated_capacity + 1);
          }
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&origname);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,psVar7);
          cxxres._M_dataplus._M_p = (pointer)&cxxres.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&cxxres,sourceListValue._M_dataplus._M_p,
                     sourceListValue._M_dataplus._M_p + sourceListValue._M_string_length);
          std::__cxx11::string::append((char *)&cxxres);
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commandLine,psVar7);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-c","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-h","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commandLine,&varName);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commandLine,&cxxres);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commandLine,&origname);
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     (value_type *)&commandLine);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          no_main_dependency._M_string_length = 0;
          no_main_dependency.field_2._M_local_buf[0] = '\0';
          pcVar4 = (this->super_cmCommand).Makefile;
          sf = (cmSourceFile *)&local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sf,"","");
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"","");
          cmMakefile::AddCustomCommandToOutput
                    (pcVar4,&cxxres,&depends,&no_main_dependency,&commandLines,(char *)0x0,
                     (char *)0x0,false,true,false,false,(string *)&sf,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sf != &local_118) {
            operator_delete(sf,local_118._M_allocated_capacity + 1);
          }
          pcVar4 = (this->super_cmCommand).Makefile;
          sf = (cmSourceFile *)&local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sf,"","");
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"","");
          cmMakefile::AddCustomCommandToOutput
                    (pcVar4,&varName,&depends,&no_main_dependency,&commandLines,(char *)0x0,
                     (char *)0x0,false,true,false,false,(string *)&sf,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sf != &local_118) {
            operator_delete(sf,local_118._M_allocated_capacity + 1);
          }
          sf = cmMakefile::GetSource((this->super_cmCommand).Makefile,&cxxres,Ambiguous);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&sf->Depends,&varName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&sf->Depends,&origname);
          __position._M_current =
               (this->GeneratedSourcesClasses).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->GeneratedSourcesClasses).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                       &this->GeneratedSourcesClasses,__position,&sf);
          }
          else {
            *__position._M_current = sf;
            pppcVar1 = &(this->GeneratedSourcesClasses).
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commandLine);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cxxres._M_dataplus._M_p != &cxxres.field_2) {
            operator_delete(cxxres._M_dataplus._M_p,cxxres.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&depends);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)origname._M_dataplus._M_p != &origname.field_2) {
            operator_delete(origname._M_dataplus._M_p,origname.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)varName._M_dataplus._M_p != &varName.field_2) {
            operator_delete(varName._M_dataplus._M_p,varName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&sourceListValue,"WRAP_EXCLUDE","");
          bVar6 = cmSourceFile::GetPropertyAsBool(this_00,&sourceListValue);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_00240ed7;
        }
        psVar8 = psVar8 + 1;
      } while (psVar8 != pbVar5);
    }
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity =
         sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
    lVar15 = (long)(this->GeneratedSourcesClasses).
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->GeneratedSourcesClasses).
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar15 != 0) {
      lVar15 = lVar15 >> 3;
      lVar13 = 0;
      lVar14 = 0;
      do {
        if (lVar14 == 0) {
          ppcVar10 = (this->GeneratedSourcesClasses).
                     super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        else {
          std::__cxx11::string::append((char *)&sourceListValue);
          ppcVar10 = (pointer)((long)(this->GeneratedSourcesClasses).
                                     super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar13);
        }
        psVar7 = cmSourceFile::GetFullPath(*ppcVar10,(string *)0x0);
        std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)(psVar7->_M_dataplus)._M_p);
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 8;
      } while (lVar15 + (ulong)(lVar15 == 0) != lVar14);
    }
    pcVar3 = (this->Target)._M_dataplus._M_p;
    varName._M_dataplus._M_p = (pointer)&varName.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&varName,pcVar3,pcVar3 + (this->Target)._M_string_length);
    std::__cxx11::string::append((char *)&varName);
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&varName,sourceListValue._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)varName._M_dataplus._M_p != &varName.field_2) {
      operator_delete(varName._M_dataplus._M_p,varName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputDirectory._M_dataplus._M_p != &outputDirectory.field_2) {
      operator_delete(outputDirectory._M_dataplus._M_p,
                      outputDirectory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cdir._M_dataplus._M_p == &cdir.field_2) goto LAB_002416d0;
  }
  operator_delete(cdir._M_dataplus._M_p,cdir.field_2._M_allocated_capacity + 1);
LAB_002416d0:
  return 0x20 < uVar12;
}

Assistant:

bool cmFLTKWrapUICommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // what is the current source dir
  std::string cdir = this->Makefile->GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    this->Makefile->GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // get parameter for the command
  this->Target = args[0]; // Target that will use the generated files

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = this->Makefile->GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    this->Makefile->AddIncludeDirectories(outputDirectories);
  }

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = this->Makefile->GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = outputDirectory;
      outName += "/";
      outName += cmSystemTools::GetFilenameWithoutExtension(arg);
      std::string hname = outName;
      hname += ".h";
      std::string origname = cdir + "/" + arg;
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = outName;
      cxxres += ".cxx";

      cmCustomCommandLine commandLine;
      commandLine.push_back(fluid_exe);
      commandLine.push_back("-c"); // instructs Fluid to run in command line
      commandLine.push_back("-h"); // optionally rename .h files
      commandLine.push_back(hname);
      commandLine.push_back("-o"); // optionally rename .cxx files
      commandLine.push_back(cxxres);
      commandLine.push_back(origname); // name of the GUI fluid file
      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      // Add command for generating the .h and .cxx files
      std::string no_main_dependency;
      const char* no_comment = nullptr;
      const char* no_working_dir = nullptr;
      this->Makefile->AddCustomCommandToOutput(
        cxxres, depends, no_main_dependency, commandLines, no_comment,
        no_working_dir);
      this->Makefile->AddCustomCommandToOutput(
        hname, depends, no_main_dependency, commandLines, no_comment,
        no_working_dir);

      cmSourceFile* sf = this->Makefile->GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      this->GeneratedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = this->GeneratedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += this->GeneratedSourcesClasses[classNum]->GetFullPath();
  }
  std::string varName = this->Target;
  varName += "_FLTK_UI_SRCS";
  this->Makefile->AddDefinition(varName, sourceListValue.c_str());

  return true;
}